

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
llvm::cl::TokenizeGNUCommandLine
          (cl *this,StringRef Src,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
          bool MarkEOLs)

{
  cl cVar1;
  uint uVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  StringRef S;
  StringRef SVar7;
  char C;
  SmallString<128U> Token;
  cl local_e1;
  char *local_e0;
  SmallVectorTemplateBase<const_char_*,_true> *local_d8;
  undefined4 local_cc;
  StringSaver *local_c8;
  SmallVectorTemplateBase<char,_true> local_c0;
  undefined1 local_b0 [128];
  
  local_c8 = (StringSaver *)Src.Length;
  pcVar4 = Src.Data;
  cVar3 = (char)NewArgv;
  local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = local_b0;
  local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
  local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x80;
  local_d8 = (SmallVectorTemplateBase<const_char_*,_true> *)Saver;
  if (pcVar4 != (char *)0x0) {
    pcVar5 = (char *)0x0;
    uVar2 = 0;
    local_cc = (int)NewArgv;
    do {
      if (uVar2 == 0) {
        while( true ) {
          if (pcVar4 <= pcVar5) goto LAB_0013e13c;
          cVar1 = this[(long)pcVar5];
          if ((0x20 < (ulong)(byte)cVar1) ||
             ((0x100002600U >> ((ulong)(byte)cVar1 & 0x3f) & 1) == 0)) break;
          if (cVar1 == (cl)0xa && cVar3 == '\x01') {
            local_e0 = (char *)0x0;
            SmallVectorTemplateBase<const_char_*,_true>::push_back
                      ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e0);
          }
          pcVar5 = pcVar5 + 1;
          if (pcVar4 == pcVar5) goto LAB_0013e0cd;
        }
      }
      Saver = (StringSaver *)local_d8;
      if (pcVar4 <= pcVar5) {
LAB_0013e13c:
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      local_e1 = this[(long)pcVar5];
      pcVar6 = pcVar5 + 1;
      if (pcVar6 < pcVar4 && local_e1 == (cl)0x5c) {
        local_e0 = (char *)CONCAT71(local_e0._1_7_,this[(long)pcVar6]);
        SmallVectorTemplateBase<char,_true>::push_back(&local_c0,(char *)&local_e0);
        Saver = (StringSaver *)local_d8;
      }
      else if ((byte)local_e1 < 0x28) {
        if ((0x100002600U >> ((ulong)(byte)local_e1 & 0x3f) & 1) == 0) {
          if ((0x8400000000U >> ((ulong)(byte)local_e1 & 0x3f) & 1) == 0) goto LAB_0013e0b9;
          while( true ) {
            local_d8 = (SmallVectorTemplateBase<const_char_*,_true> *)Saver;
            if (pcVar6 == pcVar4) goto LAB_0013e0cd;
            if (pcVar4 <= pcVar6) goto LAB_0013e13c;
            if (this[(long)pcVar6] == local_e1) break;
            pcVar5 = pcVar6 + 1;
            if (pcVar6 + 1 == pcVar4) {
              pcVar5 = pcVar6;
            }
            if (this[(long)pcVar6] != (cl)0x5c) {
              pcVar5 = pcVar6;
            }
            if (pcVar4 <= pcVar5) goto LAB_0013e13c;
            local_e0._1_7_ = (undefined7)((ulong)local_e0 >> 8);
            local_e0 = (char *)CONCAT71(local_e0._1_7_,this[(long)pcVar5]);
            SmallVectorTemplateBase<char,_true>::push_back(&local_c0,(char *)&local_e0);
            pcVar6 = pcVar5 + 1;
            Saver = (StringSaver *)local_d8;
          }
        }
        else {
          if (local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0)
          {
            SVar7.Length._0_4_ =
                 local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            SVar7.Data = (char *)local_c0.super_SmallVectorTemplateCommon<char,_void>.
                                 super_SmallVectorBase.BeginX;
            SVar7.Length._4_4_ = 0;
            SVar7 = StringSaver::save(local_c8,SVar7);
            local_e0 = SVar7.Data;
            SmallVectorTemplateBase<const_char_*,_true>::push_back
                      ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e0);
          }
          local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ =
               local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
               0xffffffff00000000;
          pcVar6 = pcVar5;
        }
      }
      else {
LAB_0013e0b9:
        SmallVectorTemplateBase<char,_true>::push_back(&local_c0,(char *)&local_e1);
        Saver = (StringSaver *)local_d8;
        pcVar6 = pcVar5;
      }
      pcVar5 = pcVar6 + 1;
      if (pcVar5 == pcVar4) goto LAB_0013e0cd;
      uVar2 = local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    } while( true );
  }
LAB_0013e100:
  if (cVar3 != '\0') {
    local_e0 = (char *)0x0;
    SmallVectorTemplateBase<const_char_*,_true>::push_back(local_d8,&local_e0);
  }
  if ((undefined1 *)
      local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_b0)
  {
    free(local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
LAB_0013e0cd:
  cVar3 = (char)local_cc;
  if (local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) {
    S.Length._0_4_ = local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
    ;
    S.Data = (char *)local_c0.super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                     BeginX;
    S.Length._4_4_ = 0;
    SVar7 = StringSaver::save(local_c8,S);
    local_e0 = SVar7.Data;
    SmallVectorTemplateBase<const_char_*,_true>::push_back(local_d8,&local_e0);
  }
  goto LAB_0013e100;
}

Assistant:

void cl::TokenizeGNUCommandLine(StringRef Src, StringSaver &Saver,
                                SmallVectorImpl<const char *> &NewArgv,
                                bool MarkEOLs) {
  SmallString<128> Token;
  for (size_t I = 0, E = Src.size(); I != E; ++I) {
    // Consume runs of whitespace.
    if (Token.empty()) {
      while (I != E && isWhitespace(Src[I])) {
        // Mark the end of lines in response files
        if (MarkEOLs && Src[I] == '\n')
          NewArgv.push_back(nullptr);
        ++I;
      }
      if (I == E)
        break;
    }

    char C = Src[I];

    // Backslash escapes the next character.
    if (I + 1 < E && C == '\\') {
      ++I; // Skip the escape.
      Token.push_back(Src[I]);
      continue;
    }

    // Consume a quoted string.
    if (isQuote(C)) {
      ++I;
      while (I != E && Src[I] != C) {
        // Backslash escapes the next character.
        if (Src[I] == '\\' && I + 1 != E)
          ++I;
        Token.push_back(Src[I]);
        ++I;
      }
      if (I == E)
        break;
      continue;
    }

    // End the token if this is whitespace.
    if (isWhitespace(C)) {
      if (!Token.empty())
        NewArgv.push_back(Saver.save(StringRef(Token)).data());
      Token.clear();
      continue;
    }

    // This is a normal character.  Append it.
    Token.push_back(C);
  }

  // Append the last token after hitting EOF with no whitespace.
  if (!Token.empty())
    NewArgv.push_back(Saver.save(StringRef(Token)).data());
  // Mark the end of response files
  if (MarkEOLs)
    NewArgv.push_back(nullptr);
}